

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall FIX::double_conversion::UInt128::Multiply(UInt128 *this,uint32_t multiplicand)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t part;
  uint64_t accumulator;
  uint32_t multiplicand_local;
  UInt128 *this_local;
  
  uVar1 = (this->low_bits_ & 0xffffffff) * (ulong)multiplicand;
  uVar2 = (uVar1 >> 0x20) + (this->low_bits_ >> 0x20) * (ulong)multiplicand;
  this->low_bits_ = (uVar2 << 0x20) + (uVar1 & 0xffffffff);
  uVar1 = (uVar2 >> 0x20) + (this->high_bits_ & 0xffffffff) * (ulong)multiplicand;
  uVar2 = (uVar1 >> 0x20) + (this->high_bits_ >> 0x20) * (ulong)multiplicand;
  this->high_bits_ = (uVar2 << 0x20) + (uVar1 & 0xffffffff);
  if (uVar2 >> 0x20 == 0) {
    return;
  }
  __assert_fail("(accumulator >> 32) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                ,0x38,"void FIX::double_conversion::UInt128::Multiply(uint32_t)");
}

Assistant:

void Multiply(uint32_t multiplicand) {
    uint64_t accumulator;

    accumulator = (low_bits_ & kMask32) * multiplicand;
    uint32_t part = static_cast<uint32_t>(accumulator & kMask32);
    accumulator >>= 32;
    accumulator = accumulator + (low_bits_ >> 32) * multiplicand;
    low_bits_ = (accumulator << 32) + part;
    accumulator >>= 32;
    accumulator = accumulator + (high_bits_ & kMask32) * multiplicand;
    part = static_cast<uint32_t>(accumulator & kMask32);
    accumulator >>= 32;
    accumulator = accumulator + (high_bits_ >> 32) * multiplicand;
    high_bits_ = (accumulator << 32) + part;
    ASSERT((accumulator >> 32) == 0);
  }